

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::Encode(EntityDestinationRecord *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  EntityDestinationRecord *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_Entity);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16DstCommsDvcID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DstLineID);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8DstPriority);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8LnStCmd);
  KDataStream::operator<<(pKVar1,this->m_uiPadding1);
  return;
}

Assistant:

void EntityDestinationRecord::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Entity
           << m_ui16DstCommsDvcID
           << m_ui8DstLineID
           << m_ui8DstPriority
           << m_ui8LnStCmd
           << m_uiPadding1;
}